

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

ON_LengthValue *
ON_LengthValue::CreateFromSubString
          (ON_LengthValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string,
          int string_count,wchar_t **string_end)

{
  ON_ParseSettings parse_settings_00;
  LengthUnitSystem length_unit_system;
  AngleUnitSystem AVar1;
  uint uVar2;
  ON_wString local_c8;
  ON_UnitSystem local_c0;
  ON_UnitSystem local_98;
  undefined1 local_79;
  ON__UINT32 local_78 [2];
  ON__UINT32 local_70 [2];
  undefined8 local_68;
  ON__UINT64 local_60;
  int local_58;
  LengthUnitSystem local_51;
  int parse_count;
  LengthUnitSystem string_length_unit_system;
  ON_ParseSettings parse_results;
  double length_value;
  wchar_t **string_end_local;
  wchar_t *pwStack_18;
  int string_count_local;
  wchar_t *string_local;
  ON_LengthValue *rc;
  
  if ((string_end != (wchar_t **)0x0) && (&stack0xffffffffffffffe8 != string_end)) {
    *string_end = string;
  }
  pwStack_18 = string;
  string_local = (wchar_t *)__return_storage_ptr__;
  if (string_count < -1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x94,"","Invalid string_count parameter.");
    ON_LengthValue(__return_storage_ptr__,&Unset);
  }
  else if (((string == (wchar_t *)0x0) || (string_count == 0)) || (*string == L'\0')) {
    ON_LengthValue(__return_storage_ptr__,&Unset);
  }
  else {
    parse_results.m_reserved = (ON__UINT64)ON_DBL_QNAN;
    ON_ParseSettings::ON_ParseSettings((ON_ParseSettings *)&parse_count);
    parse_settings_00 = parse_settings;
    local_51 = Unset;
    local_78[0] = parse_settings.m_true_default_bits[0];
    local_78[1] = parse_settings.m_true_default_bits[1];
    parse_settings.m_false_default_bits = parse_settings_00.m_false_default_bits;
    local_70[0] = parse_settings.m_false_default_bits[0];
    local_70[1] = parse_settings.m_false_default_bits[1];
    parse_settings._16_8_ = parse_settings_00._16_8_;
    local_68._0_4_ = parse_settings.m_reserved_bits;
    local_68._4_2_ = parse_settings.m_context_locale_id;
    local_68._6_1_ = parse_settings.m_context_angle_unit_system;
    local_68._7_1_ = parse_settings.m_context_length_unit_system;
    parse_settings.m_reserved = parse_settings_00.m_reserved;
    local_60 = parse_settings.m_reserved;
    parse_settings = parse_settings_00;
    local_58 = ON_ParseLengthExpression
                         (pwStack_18,string_count,parse_settings_00,
                          (double *)&parse_results.m_reserved,(ON_ParseSettings *)&parse_count,
                          &local_51);
    if ((local_58 < 1) || ((string_count < local_58 && (-1 < string_count)))) {
      ON_LengthValue(__return_storage_ptr__,&Unset);
    }
    else {
      local_79 = 0;
      ON_LengthValue(__return_storage_ptr__);
      __return_storage_ptr__->m_length = (double)parse_results.m_reserved;
      if ((local_51 == Unset) || (local_51 == None)) {
        length_unit_system = ON_ParseSettings::ContextLengthUnitSystem(&parse_settings);
        ON_UnitSystem::ON_UnitSystem(&local_c0,length_unit_system);
        ON_UnitSystem::operator=(&__return_storage_ptr__->m_length_unit_system,&local_c0);
        ON_UnitSystem::~ON_UnitSystem(&local_c0);
      }
      else {
        ON_UnitSystem::ON_UnitSystem(&local_98,local_51);
        ON_UnitSystem::operator=(&__return_storage_ptr__->m_length_unit_system,&local_98);
        ON_UnitSystem::~ON_UnitSystem(&local_98);
      }
      AVar1 = ON_ParseSettings::ContextAngleUnitSystem(&parse_settings);
      __return_storage_ptr__->m_context_angle_unit_system = AVar1;
      uVar2 = ON_ParseSettings::ContextLocaleId(&parse_settings);
      __return_storage_ptr__->m_context_locale_id = uVar2;
      ON_wString::ON_wString(&local_c8,pwStack_18,local_58);
      ON_wString::operator=(&__return_storage_ptr__->m_length_as_string,&local_c8);
      ON_wString::~ON_wString(&local_c8);
      ON_wString::TrimLeftAndRight(&__return_storage_ptr__->m_length_as_string,(wchar_t *)0x0);
      if (string_end != (wchar_t **)0x0) {
        *string_end = pwStack_18 + local_58;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_LengthValue ON_LengthValue::CreateFromSubString(
    ON_ParseSettings parse_settings,
    const wchar_t* string,
    int string_count,
    const wchar_t** string_end
  )
{
  // All calls to some version of ON_LengthValue::CreateFrom*String(...) end up here.
  if (nullptr != string_end && &string != string_end)
    *string_end = string;

  if (string_count < -1)
  {
    ON_ERROR("Invalid string_count parameter.");
    return ON_LengthValue::Unset;
  }

  if (nullptr == string || 0 == string_count || 0 == string[0] )
  {
    // empty string fails silently.
    return ON_LengthValue::Unset;
  }

  double length_value = ON_DBL_QNAN;
  ON_ParseSettings parse_results;
  ON::LengthUnitSystem string_length_unit_system = ON::LengthUnitSystem::Unset;
  const int parse_count = ON_ParseLengthExpression(
    string,
    string_count,
    parse_settings, 
    &length_value,
    &parse_results,
    &string_length_unit_system
  );

  if ( parse_count <= 0 
    || (parse_count > string_count && string_count >= 0)
    || false == (length_value == length_value) 
    ) 
  {
    // Calling ON_ERROR HERE .NET wrapper trauma when CreateFromSubString() is used for string validation.
    // ON_ERROR("Input string parameter is not valid.");
    return ON_LengthValue::Unset;
  }

  ON_LengthValue rc;

  rc.m_length = length_value;

  if (ON::LengthUnitSystem::Unset != string_length_unit_system && ON::LengthUnitSystem::None != string_length_unit_system)
    rc.m_length_unit_system = ON_UnitSystem(string_length_unit_system);
  else
    rc.m_length_unit_system = ON_UnitSystem(parse_settings.ContextLengthUnitSystem());

  rc.m_context_angle_unit_system = parse_settings.ContextAngleUnitSystem();
  rc.m_context_locale_id = parse_settings.ContextLocaleId();

  rc.m_length_as_string = ON_wString(string, parse_count);
  rc.m_length_as_string.TrimLeftAndRight();

  if (nullptr != string_end)
    *string_end = string + parse_count;

  return rc;
}